

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

void __thiscall front::syntax::SyntaxAnalyze::gm_var_decl(SyntaxAnalyze *this)

{
  bool bVar1;
  undefined8 in_RDI;
  SyntaxAnalyze *unaff_retaddr;
  Token in_stack_0000015c;
  SyntaxAnalyze *in_stack_00000160;
  SyntaxAnalyze *in_stack_00000980;
  
  match_one_word(in_stack_00000160,in_stack_0000015c);
  gm_var_def(in_stack_00000980);
  while( true ) {
    bVar1 = try_word(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(Token)in_RDI);
    if (!bVar1) break;
    match_one_word(in_stack_00000160,in_stack_0000015c);
    gm_var_def(in_stack_00000980);
  }
  match_one_word(in_stack_00000160,in_stack_0000015c);
  return;
}

Assistant:

void SyntaxAnalyze::gm_var_decl() {
  match_one_word(Token::INTTK);
  gm_var_def();
  while (try_word(1, Token::COMMA)) {
    match_one_word(Token::COMMA);
    gm_var_def();
  }
  match_one_word(Token::SEMICN);
}